

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InlinePass::AddLoad
          (InlinePass *this,uint32_t type_id,uint32_t resultId,uint32_t ptr_id,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *block_ptr,Instruction *line_inst,DebugScope *dbg_scope)

{
  IRContext *c;
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac [3];
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  this_00 = (Instruction *)operator_new(0x70);
  c = (this->super_Pass).context_;
  init_list._M_len = 1;
  init_list._M_array = local_ac;
  local_ac[0] = ptr_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_ac[1] = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,&local_58);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
             local_ac + 1,&local_78);
  Instruction::Instruction(this_00,c,OpLoad,type_id,resultId,(OperandList *)&local_78);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  if (line_inst != (Instruction *)0x0) {
    Instruction::AddDebugLine(this_00,line_inst);
  }
  Instruction::SetDebugScope(this_00,dbg_scope);
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            ((IntrusiveNodeBase<spvtools::opt::Instruction> *)this_00,
             (Instruction *)
             ((long)&(((block_ptr->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->
                     insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8));
  return;
}

Assistant:

void InlinePass::AddLoad(uint32_t type_id, uint32_t resultId, uint32_t ptr_id,
                         std::unique_ptr<BasicBlock>* block_ptr,
                         const Instruction* line_inst,
                         const DebugScope& dbg_scope) {
  std::unique_ptr<Instruction> newLoad(
      new Instruction(context(), spv::Op::OpLoad, type_id, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ptr_id}}}));
  if (line_inst != nullptr) {
    newLoad->AddDebugLine(line_inst);
  }
  newLoad->SetDebugScope(dbg_scope);
  (*block_ptr)->AddInstruction(std::move(newLoad));
}